

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<8>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  undefined4 uVar20;
  ulong unaff_RBP;
  NodeRef *pNVar21;
  NodeRef *pNVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  vint4 ai_5;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 ai_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_3;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_4;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 bi_2;
  vint4 bi;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar35._4_4_ = fVar2;
  auVar35._0_4_ = fVar2;
  auVar35._8_4_ = fVar2;
  auVar35._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar37._4_4_ = fVar3;
  auVar37._0_4_ = fVar3;
  auVar37._8_4_ = fVar3;
  auVar37._12_4_ = fVar3;
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar45._4_4_ = fVar7;
  auVar45._0_4_ = fVar7;
  auVar45._8_4_ = fVar7;
  auVar45._12_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar47._4_4_ = fVar8;
  auVar47._0_4_ = fVar8;
  auVar47._8_4_ = fVar8;
  auVar47._12_4_ = fVar8;
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar48._4_4_ = fVar9;
  auVar48._0_4_ = fVar9;
  auVar48._8_4_ = fVar9;
  auVar48._12_4_ = fVar9;
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar49._4_4_ = iVar10;
  auVar49._0_4_ = iVar10;
  auVar49._8_4_ = iVar10;
  auVar49._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar51._4_4_ = iVar10;
  auVar51._0_4_ = iVar10;
  auVar51._8_4_ = iVar10;
  auVar51._12_4_ = iVar10;
  auVar52._0_4_ = fVar7 * -fVar1;
  auVar52._4_4_ = fVar7 * -fVar1;
  auVar52._8_4_ = fVar7 * -fVar1;
  auVar52._12_4_ = fVar7 * -fVar1;
  auVar53._0_4_ = fVar8 * -fVar2;
  auVar53._4_4_ = fVar8 * -fVar2;
  auVar53._8_4_ = fVar8 * -fVar2;
  auVar53._12_4_ = fVar8 * -fVar2;
  auVar54._0_4_ = fVar9 * -fVar3;
  auVar54._4_4_ = fVar9 * -fVar3;
  auVar54._8_4_ = fVar9 * -fVar3;
  auVar54._12_4_ = fVar9 * -fVar3;
  pNVar22 = stack + 1;
  do {
    pNVar21 = pNVar22;
    if (pNVar21 == stack) break;
    pNVar22 = pNVar21 + -1;
    sVar25 = pNVar21[-1].ptr;
    do {
      if ((sVar25 & 8) == 0) {
        fVar2 = *(float *)(ray + k * 4 + 0xe0);
        uVar17 = (uint)sVar25 & 7;
        uVar16 = sVar25 & 0xfffffffffffffff0;
        if (uVar17 == 3) {
          auVar28 = *(undefined1 (*) [16])(uVar16 + 0x80);
          auVar13 = *(undefined1 (*) [16])(uVar16 + 0x90);
          auVar34 = *(undefined1 (*) [16])(uVar16 + 0xa0);
          auVar50._0_4_ = fVar2 * *(float *)(uVar16 + 0xe0);
          auVar50._4_4_ = fVar2 * *(float *)(uVar16 + 0xe4);
          auVar50._8_4_ = fVar2 * *(float *)(uVar16 + 0xe8);
          auVar50._12_4_ = fVar2 * *(float *)(uVar16 + 0xec);
          auVar38._0_4_ = fVar6 * auVar28._0_4_;
          auVar38._4_4_ = fVar6 * auVar28._4_4_;
          auVar38._8_4_ = fVar6 * auVar28._8_4_;
          auVar38._12_4_ = fVar6 * auVar28._12_4_;
          auVar41._0_4_ = fVar6 * auVar13._0_4_;
          auVar41._4_4_ = fVar6 * auVar13._4_4_;
          auVar41._8_4_ = fVar6 * auVar13._8_4_;
          auVar41._12_4_ = fVar6 * auVar13._12_4_;
          auVar32._4_4_ = uVar5;
          auVar32._0_4_ = uVar5;
          auVar32._8_4_ = uVar5;
          auVar32._12_4_ = uVar5;
          auVar38 = vfmadd231ps_fma(auVar38,auVar32,*(undefined1 (*) [16])(uVar16 + 0x50));
          auVar14 = vfmadd231ps_fma(auVar41,auVar32,*(undefined1 (*) [16])(uVar16 + 0x60));
          auVar12._4_4_ = uVar4;
          auVar12._0_4_ = uVar4;
          auVar12._8_4_ = uVar4;
          auVar12._12_4_ = uVar4;
          auVar41 = vfmadd231ps_fma(auVar38,auVar12,*(undefined1 (*) [16])(uVar16 + 0x20));
          auVar29 = vfmadd231ps_fma(auVar14,auVar12,*(undefined1 (*) [16])(uVar16 + 0x30));
          auVar56._8_4_ = 0x7fffffff;
          auVar56._0_8_ = 0x7fffffff7fffffff;
          auVar56._12_4_ = 0x7fffffff;
          auVar38 = vandps_avx(auVar56,auVar41);
          auVar31._8_4_ = 0x219392ef;
          auVar31._0_8_ = 0x219392ef219392ef;
          auVar31._12_4_ = 0x219392ef;
          auVar38 = vcmpps_avx(auVar38,auVar31,1);
          auVar14 = vblendvps_avx(auVar41,auVar31,auVar38);
          auVar38 = vandps_avx(auVar56,auVar29);
          auVar38 = vcmpps_avx(auVar38,auVar31,1);
          auVar41 = vblendvps_avx(auVar29,auVar31,auVar38);
          fVar3 = 1.0 - fVar2;
          auVar42._0_4_ = fVar6 * auVar34._0_4_;
          auVar42._4_4_ = fVar6 * auVar34._4_4_;
          auVar42._8_4_ = fVar6 * auVar34._8_4_;
          auVar42._12_4_ = fVar6 * auVar34._12_4_;
          auVar38 = vfmadd231ps_fma(auVar42,auVar32,*(undefined1 (*) [16])(uVar16 + 0x70));
          auVar29 = vfmadd231ps_fma(auVar38,auVar12,*(undefined1 (*) [16])(uVar16 + 0x40));
          auVar38 = vandps_avx(auVar56,auVar29);
          auVar38 = vcmpps_avx(auVar38,auVar31,1);
          auVar38 = vblendvps_avx(auVar29,auVar31,auVar38);
          auVar29._4_4_ = fVar3;
          auVar29._0_4_ = fVar3;
          auVar29._8_4_ = fVar3;
          auVar29._12_4_ = fVar3;
          auVar57._0_4_ = fVar2 * *(float *)(uVar16 + 0xf0);
          auVar57._4_4_ = fVar2 * *(float *)(uVar16 + 0xf4);
          auVar57._8_4_ = fVar2 * *(float *)(uVar16 + 0xf8);
          auVar57._12_4_ = fVar2 * *(float *)(uVar16 + 0xfc);
          auVar32 = ZEXT816(0) << 0x20;
          auVar30 = vfmadd231ps_fma(auVar50,auVar29,auVar32);
          auVar31 = vfmadd231ps_fma(auVar57,auVar29,auVar32);
          auVar58._0_4_ = fVar2 * *(float *)(uVar16 + 0x100);
          auVar58._4_4_ = fVar2 * *(float *)(uVar16 + 0x104);
          auVar58._8_4_ = fVar2 * *(float *)(uVar16 + 0x108);
          auVar58._12_4_ = fVar2 * *(float *)(uVar16 + 0x10c);
          auVar36 = vfmadd231ps_fma(auVar58,auVar29,auVar32);
          auVar39._0_4_ = fVar3 + fVar2 * *(float *)(uVar16 + 0x110);
          auVar39._4_4_ = fVar3 + fVar2 * *(float *)(uVar16 + 0x114);
          auVar39._8_4_ = fVar3 + fVar2 * *(float *)(uVar16 + 0x118);
          auVar39._12_4_ = fVar3 + fVar2 * *(float *)(uVar16 + 0x11c);
          auVar43._0_4_ = fVar3 + fVar2 * *(float *)(uVar16 + 0x120);
          auVar43._4_4_ = fVar3 + fVar2 * *(float *)(uVar16 + 0x124);
          auVar43._8_4_ = fVar3 + fVar2 * *(float *)(uVar16 + 0x128);
          auVar43._12_4_ = fVar3 + fVar2 * *(float *)(uVar16 + 300);
          auVar55._0_4_ = fVar2 * *(float *)(uVar16 + 0x130) + fVar3;
          auVar55._4_4_ = fVar2 * *(float *)(uVar16 + 0x134) + fVar3;
          auVar55._8_4_ = fVar2 * *(float *)(uVar16 + 0x138) + fVar3;
          auVar55._12_4_ = fVar2 * *(float *)(uVar16 + 0x13c) + fVar3;
          auVar29 = vrcpps_avx(auVar14);
          auVar33._8_4_ = 0x3f800000;
          auVar33._0_8_ = &DAT_3f8000003f800000;
          auVar33._12_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar14,auVar29,auVar33);
          auVar29 = vfmadd132ps_fma(auVar14,auVar29,auVar29);
          auVar14 = vrcpps_avx(auVar41);
          auVar41 = vfnmadd213ps_fma(auVar41,auVar14,auVar33);
          auVar32 = vfmadd132ps_fma(auVar41,auVar14,auVar14);
          auVar14 = vrcpps_avx(auVar38);
          auVar38 = vfnmadd213ps_fma(auVar38,auVar14,auVar33);
          auVar12 = vfmadd132ps_fma(auVar38,auVar14,auVar14);
          auVar28 = vfmadd213ps_fma(auVar28,auVar37,*(undefined1 (*) [16])(uVar16 + 0xb0));
          auVar38 = vfmadd231ps_fma(auVar28,auVar35,*(undefined1 (*) [16])(uVar16 + 0x50));
          auVar28 = vfmadd213ps_fma(auVar13,auVar37,*(undefined1 (*) [16])(uVar16 + 0xc0));
          auVar13 = vfmadd231ps_fma(auVar28,auVar35,*(undefined1 (*) [16])(uVar16 + 0x60));
          auVar28 = vfmadd213ps_fma(auVar34,auVar37,*(undefined1 (*) [16])(uVar16 + 0xd0));
          auVar28 = vfmadd231ps_fma(auVar28,auVar35,*(undefined1 (*) [16])(uVar16 + 0x70));
          auVar14._4_4_ = fVar1;
          auVar14._0_4_ = fVar1;
          auVar14._8_4_ = fVar1;
          auVar14._12_4_ = fVar1;
          auVar34 = vfmadd231ps_fma(auVar38,auVar14,*(undefined1 (*) [16])(uVar16 + 0x20));
          auVar38 = vfmadd231ps_fma(auVar13,auVar14,*(undefined1 (*) [16])(uVar16 + 0x30));
          auVar41 = vfmadd231ps_fma(auVar28,auVar14,*(undefined1 (*) [16])(uVar16 + 0x40));
          auVar28 = vsubps_avx(auVar30,auVar34);
          auVar13 = vsubps_avx(auVar39,auVar34);
          auVar34 = vsubps_avx(auVar31,auVar38);
          auVar38 = vsubps_avx(auVar43,auVar38);
          auVar14 = vsubps_avx(auVar36,auVar41);
          auVar41 = vsubps_avx(auVar55,auVar41);
          auVar30._0_4_ = auVar29._0_4_ * auVar28._0_4_;
          auVar30._4_4_ = auVar29._4_4_ * auVar28._4_4_;
          auVar30._8_4_ = auVar29._8_4_ * auVar28._8_4_;
          auVar30._12_4_ = auVar29._12_4_ * auVar28._12_4_;
          auVar36._0_4_ = auVar29._0_4_ * auVar13._0_4_;
          auVar36._4_4_ = auVar29._4_4_ * auVar13._4_4_;
          auVar36._8_4_ = auVar29._8_4_ * auVar13._8_4_;
          auVar36._12_4_ = auVar29._12_4_ * auVar13._12_4_;
          auVar40._0_4_ = auVar32._0_4_ * auVar34._0_4_;
          auVar40._4_4_ = auVar32._4_4_ * auVar34._4_4_;
          auVar40._8_4_ = auVar32._8_4_ * auVar34._8_4_;
          auVar40._12_4_ = auVar32._12_4_ * auVar34._12_4_;
          auVar44._0_4_ = auVar12._0_4_ * auVar14._0_4_;
          auVar44._4_4_ = auVar12._4_4_ * auVar14._4_4_;
          auVar44._8_4_ = auVar12._8_4_ * auVar14._8_4_;
          auVar44._12_4_ = auVar12._12_4_ * auVar14._12_4_;
          auVar34._0_4_ = auVar32._0_4_ * auVar38._0_4_;
          auVar34._4_4_ = auVar32._4_4_ * auVar38._4_4_;
          auVar34._8_4_ = auVar32._8_4_ * auVar38._8_4_;
          auVar34._12_4_ = auVar32._12_4_ * auVar38._12_4_;
          auVar46._0_4_ = auVar12._0_4_ * auVar41._0_4_;
          auVar46._4_4_ = auVar12._4_4_ * auVar41._4_4_;
          auVar46._8_4_ = auVar12._8_4_ * auVar41._8_4_;
          auVar46._12_4_ = auVar12._12_4_ * auVar41._12_4_;
          auVar28 = vpminsd_avx(auVar40,auVar34);
          auVar13 = vpminsd_avx(auVar44,auVar46);
          auVar28 = vmaxps_avx(auVar28,auVar13);
          auVar14 = vpminsd_avx(auVar30,auVar36);
          auVar38 = vpmaxsd_avx(auVar30,auVar36);
          auVar13 = vpmaxsd_avx(auVar40,auVar34);
          auVar34 = vpmaxsd_avx(auVar44,auVar46);
          auVar34 = vminps_avx(auVar13,auVar34);
          auVar13 = vmaxps_avx(auVar49,auVar14);
          auVar28 = vmaxps_avx(auVar13,auVar28);
          auVar13 = vminps_avx(auVar51,auVar38);
          auVar13 = vminps_avx(auVar13,auVar34);
          auVar28 = vcmpps_avx(auVar28,auVar13,2);
        }
        else {
          auVar27._4_4_ = fVar2;
          auVar27._0_4_ = fVar2;
          auVar27._8_4_ = fVar2;
          auVar27._12_4_ = fVar2;
          auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar23),auVar27,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + uVar23));
          auVar28 = vfmadd213ps_fma(auVar28,auVar45,auVar52);
          auVar13 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar19),auVar27,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + uVar19));
          auVar13 = vfmadd213ps_fma(auVar13,auVar47,auVar53);
          auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar26),auVar27,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + uVar26));
          auVar28 = vpmaxsd_avx(auVar28,auVar13);
          auVar13 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar23 ^ 0x10)),auVar27,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + (uVar23 ^ 0x10)));
          auVar38 = vfmadd213ps_fma(auVar34,auVar48,auVar54);
          auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar19 ^ 0x10)),auVar27,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + (uVar19 ^ 0x10)));
          auVar13 = vfmadd213ps_fma(auVar13,auVar45,auVar52);
          auVar34 = vfmadd213ps_fma(auVar34,auVar47,auVar53);
          auVar34 = vpminsd_avx(auVar13,auVar34);
          auVar13 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar26 ^ 0x10)),auVar27,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + (uVar26 ^ 0x10)));
          auVar14 = vfmadd213ps_fma(auVar13,auVar48,auVar54);
          auVar13 = vpmaxsd_avx(auVar38,auVar49);
          auVar28 = vpmaxsd_avx(auVar28,auVar13);
          auVar13 = vpminsd_avx(auVar14,auVar51);
          auVar13 = vpminsd_avx(auVar34,auVar13);
          if (uVar17 == 6) {
            auVar13 = vcmpps_avx(auVar28,auVar13,2);
            auVar28 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar27,2);
            auVar34 = vcmpps_avx(auVar27,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
            auVar28 = vandps_avx(auVar28,auVar34);
            auVar28 = vandps_avx(auVar28,auVar13);
          }
          else {
            auVar28 = vcmpps_avx(auVar28,auVar13,2);
          }
          auVar28 = vpslld_avx(auVar28,0x1f);
        }
        uVar20 = vmovmskps_avx(auVar28);
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar20);
      }
      if ((sVar25 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar17 = 4;
        }
        else {
          uVar24 = sVar25 & 0xfffffffffffffff0;
          lVar18 = 0;
          for (uVar16 = unaff_RBP; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar17 = 0;
          for (uVar16 = unaff_RBP - 1 & unaff_RBP; sVar25 = *(size_t *)(uVar24 + lVar18 * 8),
              uVar16 != 0; uVar16 = uVar16 - 1 & uVar16) {
            pNVar22->ptr = sVar25;
            pNVar22 = pNVar22 + 1;
            lVar18 = 0;
            for (uVar11 = uVar16; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
          }
        }
      }
      else {
        uVar17 = 6;
      }
    } while (uVar17 == 0);
    if (uVar17 == 6) {
      cVar15 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar25 & 0xfffffffffffffff0) * 0x40 + 0x28))(pre,ray,k);
      uVar17 = 0;
      if (cVar15 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar17 = 1;
      }
    }
  } while ((uVar17 & 3) == 0);
  return pNVar21 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }